

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O2

CSharedMemoryObjectManager * CorUnix::InternalNew<CorUnix::CSharedMemoryObjectManager>(void)

{
  CSharedMemoryObjectManager *this;
  
  this = (CSharedMemoryObjectManager *)InternalMalloc(0x180);
  if (this != (CSharedMemoryObjectManager *)0x0) {
    CSharedMemoryObjectManager::CSharedMemoryObjectManager(this);
  }
  return this;
}

Assistant:

T* InternalNew()
    {
        INTERNAL_NEW_COMMON();
        return new (pMem) T();
    }